

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O0

void __thiscall
EnvironmentMap::CmdTransferOwnership
          (EnvironmentMap *this,shared_ptr<myvk::CommandBuffer> *command_buffer,
          uint32_t src_queue_family,uint32_t dst_queue_family,VkPipelineStageFlags src_stage,
          VkPipelineStageFlags dst_stage)

{
  initializer_list<VkImageMemoryBarrier> __l;
  bool bVar1;
  element_type *__a;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 *puVar2;
  undefined8 uVar3;
  VkImageLayout new_layout;
  undefined4 uVar4;
  uint32_t in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  VkPipelineStageFlags in_stack_fffffffffffffee8;
  VkPipelineStageFlags in_stack_fffffffffffffeec;
  CommandBuffer *in_stack_fffffffffffffef0;
  undefined1 local_c8 [72];
  undefined1 *local_80;
  undefined8 local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  bVar1 = Empty((EnvironmentMap *)0x16a337);
  if (!bVar1) {
    __a = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16a34f);
    uVar3 = 0;
    new_layout = VK_IMAGE_LAYOUT_UNDEFINED;
    uVar4 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
              ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x16a393);
    uStack_50 = CONCAT44(uVar4,new_layout);
    local_48 = 0;
    local_58 = uVar3;
    std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
              ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x16a3b9);
    std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16a3c7);
    myvk::ImageBase::GetMemoryBarrier
              ((ImageBase *)CONCAT44(local_20,local_1c),(VkImageAspectFlags)((ulong)__a >> 0x20),
               (VkAccessFlags)__a,(VkAccessFlags)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
               (VkImageLayout)in_stack_fffffffffffffeb0,new_layout,(uint32_t)in_RDI,
               in_stack_fffffffffffffee0);
    puVar2 = local_c8;
    std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16a41f);
    myvk::ImageBase::GetMemoryBarrier
              ((ImageBase *)CONCAT44(local_20,local_1c),(VkImageAspectFlags)((ulong)__a >> 0x20),
               (VkAccessFlags)__a,(VkAccessFlags)((ulong)puVar2 >> 0x20),(VkImageLayout)puVar2,
               new_layout,(uint32_t)in_RDI,in_stack_fffffffffffffee0);
    local_80 = &stack0xfffffffffffffef0;
    local_78 = 2;
    std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x16a484);
    __l._M_len._0_4_ = new_layout;
    __l._M_array = (iterator)uVar3;
    __l._M_len._4_4_ = uVar4;
    std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
              ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
               CONCAT44(local_20,local_1c),__l,(allocator_type *)__a);
    myvk::CommandBuffer::CmdPipelineBarrier
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
               (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_RDI,
               (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
               CONCAT44(uVar4,new_layout));
    std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
              ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
               in_stack_fffffffffffffea0);
    std::allocator<VkImageMemoryBarrier>::~allocator
              ((allocator<VkImageMemoryBarrier> *)&stack0xfffffffffffffee3);
    std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
              (in_stack_fffffffffffffea0);
    std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
              ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
               in_stack_fffffffffffffea0);
  }
  return;
}

Assistant:

void EnvironmentMap::CmdTransferOwnership(const std::shared_ptr<myvk::CommandBuffer> &command_buffer,
                                          uint32_t src_queue_family, uint32_t dst_queue_family,
                                          VkPipelineStageFlags src_stage, VkPipelineStageFlags dst_stage) const {
	if (Empty())
		return;
	command_buffer->CmdPipelineBarrier(
	    src_stage, dst_stage, {}, {},
	    {m_hdr_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
	                                   VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, src_queue_family, dst_queue_family),
	     m_alias_table_image->GetMemoryBarrier(
	         VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
	         VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, src_queue_family, dst_queue_family)});
}